

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void __thiscall
SimpleBVH::BVH::init_boxes_recursive
          (BVH *this,
          vector<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
          *cornerlist,int node_index,int b,int e)

{
  Matrix<double,__1,_1,_0,_3,_1> *pMVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  pointer paVar5;
  undefined8 uVar6;
  Matrix<double,__1,_1,_0,_3,_1> *pMVar7;
  Matrix<double,__1,_1,_0,_3,_1> *pMVar8;
  int node_index_00;
  long lVar9;
  int e_00;
  Matrix<double,__1,_1,_0,_3,_1> *pMVar10;
  long lVar11;
  ulong uVar12;
  Matrix<double,__1,_1,_0,_3,_1> *pMVar13;
  Index index;
  Index index_1;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  
  if (e - b == 0) {
    __assert_fail("b != e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xb9,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  uVar17 = (ulong)node_index;
  paVar5 = (this->boxlist).
           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(this->boxlist).
                 super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6;
  if (uVar12 <= uVar17) {
    __assert_fail("node_index < boxlist.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xba,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  if (b + 1 == e) {
    pMVar8 = (cornerlist->
             super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start[b]._M_elems;
    pMVar7 = paVar5[uVar17]._M_elems;
    lVar9 = 0;
    pMVar10 = pMVar7;
    pMVar13 = pMVar8;
    do {
      pMVar1 = pMVar7 + lVar9;
      uVar12 = pMVar8[lVar9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
               .m_rows;
      if (*(Index *)((long)&pMVar7[lVar9].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                    + 0x18) != uVar12) {
        if (3 < uVar12) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                       );
        }
        *(ulong *)((long)&pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> +
                  0x18) = uVar12;
      }
      uVar17 = (ulong)((uint)((ulong)pMVar1 >> 3) & 1);
      if ((long)uVar12 <= (long)uVar17) {
        uVar17 = uVar12;
      }
      if (0 < (long)uVar17) {
        *(undefined8 *)&pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> =
             *(undefined8 *)
              &pMVar8[lVar9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
        ;
      }
      lVar15 = uVar12 - uVar17;
      uVar14 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
      if (1 < lVar15) {
        do {
          puVar2 = (undefined8 *)
                   ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                           m_storage.m_data + uVar17 * 8);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)
                   ((long)&((Matrix<double,__1,_1,_0,_3,_1> *)
                           &pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                           ->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> +
                   uVar17 * 8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar12) {
        do {
          *(undefined8 *)
           ((long)&((Matrix<double,__1,_1,_0,_3,_1> *)
                   &pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + uVar14 * 8) =
               *(undefined8 *)
                ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                        m_storage.m_data + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      lVar9 = lVar9 + 1;
      pMVar13 = pMVar13 + 1;
      pMVar10 = pMVar10 + 1;
    } while (lVar9 != 2);
  }
  else {
    uVar14 = (ulong)(node_index * 2);
    if (uVar12 <= uVar14) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc4,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    node_index_00 = node_index * 2 + 1;
    uVar16 = (ulong)node_index_00;
    if (uVar12 <= uVar16) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc5,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    e_00 = (e - b) / 2 + b;
    init_boxes_recursive(this,cornerlist,node_index * 2,b,e_00);
    init_boxes_recursive(this,cornerlist,node_index_00,e_00,e);
    paVar5 = (this->boxlist).
             super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(this->boxlist).
                   super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6;
    if (uVar12 <= uVar14) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xca,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    if (uVar12 <= uVar16) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xcb,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    lVar9 = *(Index *)((long)&((cornerlist->
                               super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage + 0x18);
    if (0 < lVar9) {
      lVar15 = *(Index *)((long)&paVar5[uVar14]._M_elems[0].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> +
                         0x18);
      lVar11 = 0;
      if (lVar15 < 1) {
        lVar15 = lVar11;
      }
      do {
        if (((lVar15 == lVar11) ||
            (*(Index *)((long)&paVar5[uVar16]._M_elems[0].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + 0x18)
             <= lVar11)) ||
           (*(Index *)((long)&paVar5[uVar17]._M_elems[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + 0x18)
            <= lVar11)) {
LAB_001171f0:
          __assert_fail("index >= 0 && index < size()",
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>, Level = 1]"
                       );
        }
        dVar18 = *(double *)
                  ((long)&paVar5[uVar16]._M_elems[0].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + lVar11 * 8
                  );
        dVar4 = *(double *)
                 ((long)&paVar5[uVar16 - 1]._M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + lVar11 * 8)
        ;
        if (dVar4 <= dVar18) {
          dVar18 = dVar4;
        }
        *(double *)
         ((long)&paVar5[uVar17]._M_elems[0].
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> + lVar11 * 8) =
             dVar18;
        if (((*(long *)((long)(paVar5[uVar14]._M_elems + 1) + 0x18) <= lVar11) ||
            (*(long *)((long)(paVar5[uVar16]._M_elems + 1) + 0x18) <= lVar11)) ||
           (*(long *)((long)(paVar5[uVar17]._M_elems + 1) + 0x18) <= lVar11)) goto LAB_001171f0;
        dVar18 = *(double *)((long)(paVar5[uVar16]._M_elems + 1) + lVar11 * 8);
        dVar4 = *(double *)((long)(paVar5[uVar16]._M_elems + 0xffffffffffffffff) + lVar11 * 8);
        if (dVar18 <= dVar4) {
          dVar18 = dVar4;
        }
        *(double *)((long)(paVar5[uVar17]._M_elems + 1) + lVar11 * 8) = dVar18;
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
    }
  }
  return;
}

Assistant:

void BVH::init_boxes_recursive(
    const std::vector<std::array<VectorMax3d, 2>>& cornerlist,
    int node_index,
    int b,
    int e)
{
    assert(b != e);
    assert(node_index < boxlist.size());

    if (b + 1 == e) {
        boxlist[node_index] = cornerlist[b];
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * node_index;
    int childr = 2 * node_index + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    init_boxes_recursive(cornerlist, childl, b, m);
    init_boxes_recursive(cornerlist, childr, m, e);

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());
    for (int c = 0; c < cornerlist[0][0].size(); ++c) {
        boxlist[node_index][0][c] =
            std::min(boxlist[childl][0][c], boxlist[childr][0][c]);
        boxlist[node_index][1][c] =
            std::max(boxlist[childl][1][c], boxlist[childr][1][c]);
    }
}